

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O1

Pos_index __thiscall
Gudhi::persistence_matrix::
Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
::death(Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
        *this,ID_index pivot)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  Pos_index simplexIndex;
  mapped_type local_10;
  ID_index local_c;
  
  local_c = pivot;
  pmVar1 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&this->pivotToPosition_,&local_c);
  local_10 = *pmVar1;
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&(this->
                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
                    ).indexToBar_,&local_10);
  return *(Pos_index *)&pmVar2->_M_node[1]._M_prev;
}

Assistant:

Pos_index death(ID_index pivot) const {
    Pos_index simplexIndex = _get_pivot_position(pivot);

    if constexpr (Master_matrix::Option_list::has_removable_columns) {
      return CP::indexToBar_.at(simplexIndex)->death;
    } else {
      return CP::barcode_.at(CP::indexToBar_.at(simplexIndex)).death;
    }
  }